

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-3AddBeforeQuery.cpp
# Opt level: O0

void AddPointFromAddBeforeQuery(int id,double x,double y)

{
  int in_EDI;
  pair<double,_double> pStack_28;
  double local_18;
  double local_10;
  int local_4;
  
  local_4 = in_EDI;
  std::pair<double,_double>::pair<double_&,_double_&,_true>(&pStack_28,&local_10,&local_18);
  std::pair<double,_double>::operator=(Point + Point_cnt,&pStack_28);
  Point_id[Point_cnt] = local_4;
  Point_cnt = Point_cnt + 1;
  return;
}

Assistant:

void AddPointFromAddBeforeQuery(int id, double x, double y) {
    Point[Point_cnt] = {x, y};
    Point_id[Point_cnt] = id;
    Point_cnt ++;
}